

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

void line_tilde_dsp(t_line *x,t_signal **sp)

{
  int iVar1;
  t_signal *ptVar2;
  code *f;
  
  f = line_tilde_perform;
  if (((*sp)->s_n & 7U) == 0) {
    f = line_tilde_perf8;
  }
  dsp_add(f,3,x,(*sp)->s_vec);
  ptVar2 = *sp;
  iVar1 = ptVar2->s_n;
  x->x_1overn = 1.0 / (float)iVar1;
  x->x_dspticktomsec = ptVar2->s_sr / (float)(iVar1 * 1000);
  return;
}

Assistant:

static void line_tilde_dsp(t_line *x, t_signal **sp)
{
    if(sp[0]->s_n&7)
        dsp_add(line_tilde_perform, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(line_tilde_perf8, 3, x, sp[0]->s_vec, (t_int)sp[0]->s_n);
    x->x_1overn = 1./sp[0]->s_n;
    x->x_dspticktomsec = sp[0]->s_sr / (1000 * sp[0]->s_n);
}